

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::ReserveForSummary(BamStandardIndex *this,int *numReferences)

{
  pointer pBVar1;
  value_type local_18;
  
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indexFileSummary).
      super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar1) {
    (this->m_indexFileSummary).
    super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  local_18.NumBins = 0;
  local_18.NumLinearOffsets = 0;
  local_18.FirstBinFilePosition = 0;
  local_18.FirstLinearOffsetFilePosition = 0;
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::_M_fill_assign(&this->m_indexFileSummary,(long)*numReferences,&local_18);
  return;
}

Assistant:

void BamStandardIndex::ReserveForSummary(const int& numReferences) {
    m_indexFileSummary.clear();
    m_indexFileSummary.assign( numReferences, BaiReferenceSummary() );
}